

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::api::anon_unknown_1::createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::Device>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,undefined8 context,
          Parameters *param_4)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  VkAllocationCallbacks *pVVar5;
  Environment env;
  Resources res;
  undefined1 local_268 [16];
  VkAllocationCallbacks *local_258;
  VkAllocationCallbacks *local_248;
  DestroyDeviceFunc local_240;
  VkAllocationCallbacks *local_238;
  DestroyDeviceFunc local_230;
  undefined8 local_228;
  Environment local_220;
  Resources local_1e8;
  
  local_220.vkp = *(PlatformInterface **)(this + 8);
  local_228 = context;
  local_220.vkd = Context::getDeviceInterface((Context *)this);
  local_220.device = Context::getDevice((Context *)this);
  local_220.queueFamilyIndex = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_220.programBinaries = *(BinaryCollection **)(this + 0x10);
  local_220.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_220.maxResourceConsumers = 4;
  Device::Resources::Resources(&local_1e8,&local_220,(Parameters *)&local_228);
  Device::create((Move<vk::VkDevice_s_*> *)local_268,&local_220,&local_1e8,param_4);
  uVar1 = local_268._0_8_;
  local_230 = (DestroyDeviceFunc)local_268._8_8_;
  local_238 = local_258;
  Device::create((Move<vk::VkDevice_s_*> *)local_268,&local_220,&local_1e8,param_4);
  uVar2 = local_268._0_8_;
  local_240 = (DestroyDeviceFunc)local_268._8_8_;
  local_248 = local_258;
  Device::create((Move<vk::VkDevice_s_*> *)local_268,&local_220,&local_1e8,param_4);
  pVVar5 = local_258;
  uVar4 = local_268._8_8_;
  uVar3 = local_268._0_8_;
  Device::create((Move<vk::VkDevice_s_*> *)local_268,&local_220,&local_1e8,param_4);
  if ((VkDevice)local_268._0_8_ != (VkDevice)0x0) {
    (*(code *)local_268._8_8_)((VkDevice)local_268._0_8_,local_258);
  }
  if ((VkDevice)uVar3 != (VkDevice)0x0) {
    (*(code *)uVar4)((VkDevice)uVar3,pVVar5);
  }
  if ((VkDevice)uVar2 != (VkDevice)0x0) {
    (*local_240)((VkDevice)uVar2,local_248);
  }
  if ((VkDevice)uVar1 != (VkDevice)0x0) {
    (*local_230)((VkDevice)uVar1,local_238);
  }
  local_268._0_8_ = (VkDevice_s *)&local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_268._0_8_,
             (DestroyDeviceFunc)(local_268._8_8_ + local_268._0_8_));
  if ((VkDevice_s *)local_268._0_8_ != (VkDevice_s *)&local_258) {
    operator_delete((void *)local_268._0_8_,(ulong)((long)&local_258->pUserData + 1));
  }
  ::vk::InstanceDriver::~InstanceDriver(&local_1e8.vki);
  if (local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object != (VkInstance)0x0)
  {
    (*local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance)
              (local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
               m_allocator);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}